

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O3

char * CMakeWriter::get_package_dependency_output_name(string *package_dependency)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)package_dependency);
  if (iVar1 == 0) {
    pcVar2 = "FREETYPE";
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)package_dependency);
    if (iVar1 == 0) {
      pcVar2 = "OPENGL";
    }
    else {
      pcVar2 = (package_dependency->_M_dataplus)._M_p;
    }
  }
  return pcVar2;
}

Assistant:

static const char * get_package_dependency_output_name(const std::string & package_dependency)
	{
		/*
		CMake find_package scripts do not always follow the convention of outputting
		<package_name>_INCLUDE_DIRS and <package_name>_LIBRARIES. sometimes a script
		will capitalize the package name or perhaps something more wild. for now I only
		came across the FindFreetype.cmake script which doesn't stick to convention,
		but since CMake in no way enforces the convention, other exceptions may exist.
		in either case, we normalize known exceptions here since it's bad for automation
		to have to deal with these exceptions..
		*/

		if (package_dependency == "Freetype")
			return "FREETYPE";
		else if (package_dependency == "OpenGL")
			return "OPENGL";
		else
			return package_dependency.c_str();
	}